

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int cmf5kb_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  int local_144;
  int local_118;
  int local_114;
  long local_108;
  
  uVar3 = *ido;
  uVar44 = (ulong)uVar3;
  iVar34 = uVar3 * 5 + 1;
  iVar4 = *in1;
  uVar5 = *l1;
  uVar24 = uVar5 * (uVar3 + 1);
  iVar1 = ~uVar24 * iVar4 * 2 + -3;
  iVar6 = *in2;
  iVar7 = *im1;
  lVar39 = (long)iVar7;
  lVar35 = ((long)*lot + -1) * lVar39;
  iVar9 = (int)lVar35;
  iVar31 = iVar9 + 1;
  iVar8 = *im2;
  if (((int)uVar3 < 2) && (*na != 1)) {
    if (0 < (int)uVar5) {
      bVar18 = -1 < iVar9;
      if (iVar7 < 0) {
        bVar18 = iVar9 < 1;
      }
      iVar6 = ((uVar3 * 2 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar8 = (iVar34 * uVar5 + 1) * iVar4 * 2;
      iVar9 = ((uVar3 * 3 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar34 = ((uVar3 * 4 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar2 = (uVar24 + 1) * iVar4 * 2;
      lVar25 = 1;
      iVar23 = 0;
      do {
        lVar40 = lVar39 + 1;
        iVar42 = iVar23;
        if (bVar18) {
          do {
            lVar41 = (long)(iVar6 + iVar42 + 2);
            dVar49 = cc[(long)iVar1 + lVar41 + 2];
            lVar21 = (long)(iVar8 + 2 + iVar42);
            dVar46 = cc[(long)iVar1 + lVar21 + 2];
            lVar27 = (long)(iVar9 + 2 + iVar42);
            dVar57 = cc[(long)iVar1 + lVar27 + 2];
            lVar22 = (long)(iVar34 + 2 + iVar42);
            dVar48 = cc[(long)iVar1 + lVar22 + 2];
            lVar37 = (long)(iVar6 + 3 + iVar42);
            dVar50 = cc[iVar1 + lVar37];
            lVar36 = (long)(iVar8 + 3 + iVar42);
            dVar52 = cc[iVar1 + lVar36];
            dVar54 = dVar50 + dVar52;
            lVar45 = (long)(iVar9 + 3 + iVar42);
            dVar56 = cc[iVar1 + lVar45];
            lVar30 = (long)(iVar34 + 3 + iVar42);
            dVar55 = cc[iVar1 + lVar30];
            dVar53 = dVar56 + dVar55;
            lVar38 = (long)(iVar2 + 3 + iVar42);
            dVar47 = cc[iVar1 + lVar38];
            lVar33 = (long)(iVar2 + 2 + iVar42);
            dVar51 = cc[(long)iVar1 + lVar33 + 2];
            cc[iVar1 + lVar38] = dVar54 + dVar47 + dVar53;
            dVar58 = dVar49 - dVar46;
            dVar49 = dVar49 + dVar46;
            dVar59 = dVar57 - dVar48;
            dVar57 = dVar57 + dVar48;
            dVar50 = dVar50 - dVar52;
            dVar56 = dVar56 - dVar55;
            dVar46 = dVar53 * -0.8090169943749475 + dVar54 * 0.3090169943749474 + dVar47;
            dVar55 = dVar57 * -0.8090169943749475 + dVar49 * 0.3090169943749474 + dVar51;
            cc[(long)iVar1 + lVar33 + 2] = dVar49 + dVar51 + dVar57;
            dVar52 = dVar53 * 0.3090169943749474 + dVar54 * -0.8090169943749475 + dVar47;
            dVar48 = dVar58 * 0.9510565162951536 + dVar59 * 0.5877852522924731;
            cc[iVar1 + lVar37] = dVar46 - dVar48;
            cc[iVar1 + lVar36] = dVar48 + dVar46;
            dVar46 = dVar57 * 0.3090169943749474 + dVar49 * -0.8090169943749475 + dVar51;
            dVar49 = dVar50 * 0.9510565162951536 + dVar56 * 0.5877852522924731;
            cc[(long)iVar1 + lVar41 + 2] = dVar49 + dVar55;
            dVar57 = dVar50 * 0.5877852522924731 + dVar56 * -0.9510565162951536;
            cc[(long)iVar1 + lVar27 + 2] = dVar57 + dVar46;
            dVar48 = dVar58 * 0.5877852522924731 + dVar59 * -0.9510565162951536;
            cc[iVar1 + lVar45] = dVar52 - dVar48;
            cc[iVar1 + lVar30] = dVar48 + dVar52;
            cc[(long)iVar1 + lVar22 + 2] = dVar46 - dVar57;
            bVar17 = lVar40 <= iVar31;
            if (iVar7 < 0) {
              bVar17 = lVar35 < lVar40;
            }
            cc[(long)iVar1 + lVar21 + 2] = dVar55 - dVar49;
            lVar40 = lVar40 + lVar39;
            iVar42 = iVar42 + iVar7 * 2;
          } while (bVar17);
        }
        lVar25 = lVar25 + 1;
        iVar23 = iVar23 + iVar4 * 2;
      } while (lVar25 != (ulong)uVar5 + 1);
    }
  }
  else {
    iVar2 = ~(uVar5 * 6) * iVar6 * 2 + -3;
    if (0 < (int)uVar5) {
      bVar18 = -1 < iVar9;
      if (iVar7 < 0) {
        bVar18 = iVar9 < 1;
      }
      iVar23 = (uVar5 * 9 + 1) * iVar6 * 2;
      iVar42 = (uVar5 * 8 + 1) * iVar6 * 2;
      iVar10 = (uVar5 * 10 + 1) * iVar6 * 2;
      iVar11 = (uVar5 * 7 + 1) * iVar6 * 2;
      iVar12 = (uVar5 * 6 + 1) * iVar6 * 2;
      iVar13 = ((uVar3 * 2 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar34 = (iVar34 * uVar5 + 1) * iVar4 * 2;
      iVar14 = ((uVar3 * 3 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar15 = ((uVar3 * 4 + 1) * uVar5 + 1) * iVar4 * 2;
      iVar16 = (uVar24 + 1) * iVar4 * 2;
      lVar35 = 1;
      iVar29 = 0;
      iVar28 = 0;
      do {
        iVar26 = iVar29;
        local_108 = lVar39 + 1;
        iVar32 = iVar28;
        if (bVar18) {
          do {
            dVar49 = cc[(long)iVar1 + (long)(iVar13 + iVar26 + 2) + 2];
            dVar46 = cc[(long)iVar1 + (long)(iVar34 + 2 + iVar26) + 2];
            dVar57 = cc[(long)iVar1 + (long)(iVar14 + 2 + iVar26) + 2];
            dVar48 = cc[(long)iVar1 + (long)(iVar15 + 2 + iVar26) + 2];
            dVar50 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar26)];
            dVar52 = cc[(long)iVar1 + (long)(iVar34 + 3 + iVar26)];
            dVar56 = cc[(long)iVar1 + (long)(iVar14 + 3 + iVar26)];
            dVar55 = cc[(long)iVar1 + (long)(iVar15 + 3 + iVar26)];
            dVar54 = dVar50 + dVar52;
            dVar51 = dVar56 + dVar55;
            lVar25 = (long)(iVar16 + 3 + iVar26);
            dVar53 = dVar49 + dVar46;
            ch[(long)iVar2 + (long)(iVar12 + 3 + iVar32)] = cc[iVar1 + lVar25] + dVar54 + dVar51;
            lVar40 = (long)(iVar16 + 2 + iVar26);
            dVar47 = dVar57 + dVar48;
            ch[(long)iVar2 + (long)(iVar12 + 2 + iVar32) + 2] =
                 cc[(long)iVar1 + lVar40 + 2] + dVar53 + dVar47;
            dVar49 = dVar49 - dVar46;
            dVar57 = dVar57 - dVar48;
            dVar50 = dVar50 - dVar52;
            dVar56 = dVar56 - dVar55;
            dVar59 = dVar51 * -0.8090169943749475 + dVar54 * 0.3090169943749474 + cc[iVar1 + lVar25]
            ;
            dVar55 = dVar47 * -0.8090169943749475 +
                     dVar53 * 0.3090169943749474 + cc[(long)iVar1 + lVar40 + 2];
            dVar58 = dVar50 * 0.9510565162951536 + dVar56 * 0.5877852522924731;
            dVar52 = dVar51 * 0.3090169943749474 + dVar54 * -0.8090169943749475 + cc[iVar1 + lVar25]
            ;
            dVar46 = dVar49 * 0.9510565162951536 + dVar57 * 0.5877852522924731;
            dVar50 = dVar50 * 0.5877852522924731 + dVar56 * -0.9510565162951536;
            dVar48 = dVar47 * 0.3090169943749474 +
                     dVar53 * -0.8090169943749475 + cc[(long)iVar1 + lVar40 + 2];
            dVar49 = dVar49 * 0.5877852522924731 + dVar57 * -0.9510565162951536;
            ch[(long)iVar2 + (long)(iVar11 + 3 + iVar32)] = dVar59 - dVar46;
            ch[(long)iVar2 + (long)(iVar10 + 3 + iVar32)] = dVar46 + dVar59;
            ch[(long)iVar2 + (long)(iVar11 + 2 + iVar32) + 2] = dVar58 + dVar55;
            ch[(long)iVar2 + (long)(iVar42 + 2 + iVar32) + 2] = dVar50 + dVar48;
            ch[(long)iVar2 + (long)(iVar42 + 3 + iVar32)] = dVar52 - dVar49;
            ch[(long)iVar2 + (long)(iVar23 + 3 + iVar32)] = dVar49 + dVar52;
            ch[(long)iVar2 + (long)(iVar23 + 2 + iVar32) + 2] = dVar48 - dVar50;
            ch[(long)iVar2 + (long)(iVar10 + iVar32 + 2) + 2] = dVar55 - dVar58;
            bVar17 = local_108 <= iVar31;
            if (iVar7 < 0) {
              bVar17 = iVar9 < local_108;
            }
            iVar26 = iVar26 + iVar7 * 2;
            local_108 = local_108 + lVar39;
            iVar32 = iVar32 + iVar8 * 2;
          } while (bVar17);
        }
        lVar35 = lVar35 + 1;
        iVar28 = iVar28 + iVar6 * 2;
        iVar29 = iVar29 + iVar4 * 2;
      } while (lVar35 != (ulong)uVar5 + 1);
    }
    if (1 < (int)uVar3) {
      uVar24 = uVar3 * 5;
      uVar19 = ~uVar24;
      bVar18 = -1 < iVar9;
      if (iVar7 < 0) {
        bVar18 = iVar9 < 1;
      }
      iVar34 = (uVar5 * 0xf + 1) * iVar6 * 2;
      iVar42 = (uVar5 * 0xe | 1) * iVar6 * 2;
      iVar10 = (uVar5 * 0xd + 1) * iVar6 * 2;
      iVar11 = (uVar5 * 0xc + 1) * iVar6 * 2;
      iVar12 = (uVar5 * 0xb + 1) * iVar6 * 2;
      iVar23 = ((uVar3 * 2 + 2) * uVar5 + 1) * iVar4 * 2 + 3;
      iVar13 = ((uVar24 + 2) * uVar5 + 1) * iVar4 * 2;
      iVar14 = ((uVar3 * 3 + 2) * uVar5 + 1) * iVar4 * 2;
      iVar15 = ((uVar3 * 4 + 2) * uVar5 + 1) * iVar4 * 2;
      iVar16 = ((uVar3 + 2) * uVar5 + 1) * iVar4 * 2;
      uVar43 = 2;
      local_114 = 0;
      local_118 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar20 = 1;
          local_144 = local_114;
          iVar28 = local_118;
          do {
            lVar35 = lVar39 + 1;
            iVar29 = local_144;
            iVar26 = iVar28;
            if (bVar18) {
              do {
                dVar49 = cc[(long)iVar1 + (long)(iVar23 + iVar29 + -1) + 2];
                dVar46 = cc[(long)iVar1 + (long)(iVar13 + 2 + iVar29) + 2];
                dVar57 = cc[(long)iVar1 + (long)(iVar14 + 2 + iVar29) + 2];
                dVar48 = cc[(long)iVar1 + (long)(iVar15 + 2 + iVar29) + 2];
                dVar50 = cc[(long)iVar1 + (long)(iVar23 + iVar29)];
                dVar52 = cc[(long)iVar1 + (long)(iVar13 + 3 + iVar29)];
                dVar53 = dVar49 + dVar46;
                dVar56 = cc[(long)iVar1 + (long)(iVar14 + 3 + iVar29)];
                dVar55 = cc[(long)iVar1 + (long)(iVar15 + 3 + iVar29)];
                dVar54 = dVar50 + dVar52;
                dVar51 = dVar56 + dVar55;
                lVar40 = (long)(iVar16 + 3 + iVar29);
                ch[(long)iVar2 + (long)(iVar12 + 3 + iVar26)] = cc[iVar1 + lVar40] + dVar54 + dVar51
                ;
                lVar25 = (long)(iVar16 + 2 + iVar29);
                dVar47 = dVar57 + dVar48;
                ch[(long)iVar2 + (long)(iVar12 + 2 + iVar26) + 2] =
                     cc[(long)iVar1 + lVar25 + 2] + dVar53 + dVar47;
                dVar49 = dVar49 - dVar46;
                dVar57 = dVar57 - dVar48;
                dVar50 = dVar50 - dVar52;
                dVar56 = dVar56 - dVar55;
                dVar55 = dVar51 * -0.8090169943749475 +
                         dVar54 * 0.3090169943749474 + cc[iVar1 + lVar40];
                dVar58 = dVar47 * -0.8090169943749475 +
                         dVar53 * 0.3090169943749474 + cc[(long)iVar1 + lVar25 + 2];
                dVar52 = dVar51 * 0.3090169943749474 +
                         dVar54 * -0.8090169943749475 + cc[iVar1 + lVar40];
                dVar51 = dVar50 * 0.9510565162951536 + dVar56 * 0.5877852522924731;
                dVar46 = dVar49 * 0.9510565162951536 + dVar57 * 0.5877852522924731;
                dVar50 = dVar50 * 0.5877852522924731 + dVar56 * -0.9510565162951536;
                dVar48 = dVar47 * 0.3090169943749474 +
                         dVar53 * -0.8090169943749475 + cc[(long)iVar1 + lVar25 + 2];
                dVar57 = dVar49 * 0.5877852522924731 + dVar57 * -0.9510565162951536;
                dVar56 = dVar46 + dVar55;
                dVar55 = dVar55 - dVar46;
                dVar46 = dVar58 - dVar51;
                dVar51 = dVar51 + dVar58;
                ch[(long)iVar2 + (long)(iVar11 + 3 + iVar26)] =
                     wa[(long)(int)uVar19 + uVar24 + uVar43] * dVar55 -
                     wa[(long)(int)uVar19 + uVar44 * 9 + uVar43] * dVar51;
                dVar49 = dVar50 + dVar48;
                ch[(long)iVar2 + (long)(iVar11 + 2 + iVar26) + 2] =
                     dVar51 * wa[(long)(int)uVar19 + uVar24 + uVar43] +
                     dVar55 * wa[(long)(int)uVar19 + uVar44 * 9 + uVar43];
                dVar55 = dVar52 - dVar57;
                ch[(long)iVar2 + (long)(iVar10 + 3 + iVar26)] =
                     wa[(long)(int)uVar19 + uVar44 * 6 + uVar43] * dVar55 -
                     wa[(long)(int)uVar19 + uVar44 * 10 + uVar43] * dVar49;
                dVar48 = dVar48 - dVar50;
                dVar57 = dVar57 + dVar52;
                ch[(long)iVar2 + (long)(iVar10 + 2 + iVar26) + 2] =
                     dVar49 * wa[(long)(int)uVar19 + uVar44 * 6 + uVar43] +
                     dVar55 * wa[(long)(int)uVar19 + uVar44 * 10 + uVar43];
                ch[(long)iVar2 + (long)(iVar42 + 3 + iVar26)] =
                     wa[(long)(int)uVar19 + uVar44 * 7 + uVar43] * dVar57 -
                     wa[(long)(int)uVar19 + uVar44 * 0xb + uVar43] * dVar48;
                ch[(long)iVar2 + (long)(iVar42 + 2 + iVar26) + 2] =
                     dVar48 * wa[(long)(int)uVar19 + uVar44 * 7 + uVar43] +
                     dVar57 * wa[(long)(int)uVar19 + uVar44 * 0xb + uVar43];
                ch[(long)iVar2 + (long)(iVar34 + 3 + iVar26)] =
                     wa[(long)(int)uVar19 + (long)(int)(uVar3 * 8) + uVar43] * dVar56 -
                     wa[(long)(int)uVar19 + uVar44 * 0xc + uVar43] * dVar46;
                ch[(long)iVar2 + (long)(iVar34 + 2 + iVar26) + 2] =
                     dVar46 * wa[(long)(int)uVar19 + (long)(int)(uVar3 * 8) + uVar43] +
                     dVar56 * wa[(long)(int)uVar19 + uVar44 * 0xc + uVar43];
                bVar17 = lVar35 <= iVar31;
                if (iVar7 < 0) {
                  bVar17 = iVar9 < lVar35;
                }
                lVar35 = lVar35 + lVar39;
                iVar29 = iVar29 + iVar7 * 2;
                iVar26 = iVar26 + iVar8 * 2;
              } while (bVar17);
            }
            uVar20 = uVar20 + 1;
            iVar28 = iVar28 + iVar6 * 2;
            local_144 = local_144 + iVar4 * 2;
          } while (uVar20 != uVar5 + 1);
        }
        uVar43 = uVar43 + 1;
        local_118 = local_118 + iVar6 * uVar5 * 10;
        local_114 = local_114 + iVar4 * uVar5 * 2;
      } while (uVar43 != uVar3 + 1);
    }
  }
  return 0;
}

Assistant:

int cmf5kb_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t ci2, ci3, ci4, ci5;
     int m1d;
     fft_real_t di3, di4, di5, di2, cr2, cr3, cr5, cr4, ti2, ti3, ti4;
     int m2s;
     fft_real_t ti5, dr3, dr4, dr5, dr2, tr2, tr3, tr4, tr5, chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 6));
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.0 auxiliary routine */

    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    chold1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    1] + tr2 + tr3;
	    chold2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) +
		    2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    chold1;
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    chold2;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr2 - ci5;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr2 + ci5;
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci2 + cr5;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci3 + cr4;
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    cr3 - ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = cr3 + ci4;
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = ci3 - cr4;
	    cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    ci2 - cr5;
/* L101: */
	}
    }
    return 0;
L102:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr5 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr2 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + (cc_dim4 * 5 + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr4 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1)
		    + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] + tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = cc[(m1 + (k + (
		    cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] + ti2 + ti3;
	    cr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr11 * tr2 + tr12 * tr3;
	    ci2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr11 * ti2 + tr12 * ti3;
	    cr3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + tr12 * tr2 + tr11 * tr3;
	    ci3 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + tr12 * ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = cr2 - ci5;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 1] = cr2 + ci5;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ci2 + cr5;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ci3 + cr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = cr3 - ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 1] = cr3 + ci4;
	    ch[(m2 + (k + ch_dim3 * 9) * ch_dim2 << 1) + 2] = ci3 - cr4;
	    ch[(m2 + (k + ch_dim3 * 10) * ch_dim2 << 1) + 2] = ci2 - cr5;
/* L103: */
	}
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ti5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 2];
		ti4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 2];
		tr5 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 5)
			 * cc_dim3) * cc_dim2 << 1) + 1];
		tr4 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) * cc_dim2
			<< 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 << 2)) *
			cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 1] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 1] + tr2 + tr3;
		ch[(m2 + (k + (i__ * 5 + 1) * ch_dim3) * ch_dim2 << 1) + 2] =
			cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 <<
			1) + 2] + ti2 + ti3;
		cr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr11 * tr2 + tr12 * tr3;
		ci2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr11 * ti2 + tr12 * ti3;
		cr3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + tr12 * tr2 + tr11 * tr3;
		ci3 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + tr12 * ti2 + tr11 * ti3;
		cr5 = ti11 * tr5 + ti12 * tr4;
		ci5 = ti11 * ti5 + ti12 * ti4;
		cr4 = ti12 * tr5 - ti11 * tr4;
		ci4 = ti12 * ti5 - ti11 * ti4;
		dr3 = cr3 - ci4;
		dr4 = cr3 + ci4;
		di3 = ci3 + cr4;
		di4 = ci3 - cr4;
		dr5 = cr2 + ci5;
		dr2 = cr2 - ci5;
		di5 = ci2 - cr5;
		di2 = ci2 + cr5;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] *
			di2;
		ch[(m2 + (k + (i__ * 5 + 2) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] *
			dr2;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] *
			 di3;
		ch[(m2 + (k + (i__ * 5 + 3) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] *
			 dr3;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] *
			 di4;
		ch[(m2 + (k + (i__ * 5 + 4) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] *
			 dr4;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 1] =
			wa[i__ + (wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 *
			12] * di5;
		ch[(m2 + (k + (i__ * 5 + 5) * ch_dim3) * ch_dim2 << 1) + 2] =
			wa[i__ + (wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 *
			12] * dr5;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}